

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O2

int32_t adt_hash_values(adt_hash_t *self,adt_ary_t *pArray)

{
  void **ppvVar1;
  int s32Index;
  char *pKey;
  char *local_30;
  
  s32Index = 0;
  if (pArray != (adt_ary_t *)0x0 && self != (adt_hash_t *)0x0) {
    adt_hash_iter_init(self);
    adt_ary_clear(pArray);
    adt_ary_extend(pArray,self->u32Size);
    s32Index = 0;
    do {
      ppvVar1 = adt_hash_iter_next(self,&local_30);
      if (ppvVar1 != (void **)0x0) {
        adt_ary_set(pArray,s32Index,*ppvVar1);
        s32Index = s32Index + 1;
      }
    } while (local_30 != (char *)0x0);
  }
  return s32Index;
}

Assistant:

int32_t adt_hash_values(adt_hash_t *self, adt_ary_t* pArray)
{
   const char *pKey;
   int32_t s32i=0;

   if( (self==0) || (pArray==0)) return 0;
   adt_hash_iter_init(self);
   adt_ary_clear(pArray);
   adt_ary_extend(pArray,adt_hash_length(self));
   do{
      void **ppValue = adt_hash_iter_next(self,&pKey);
      if(ppValue != 0){
         adt_ary_set(pArray,s32i++, *ppValue);
      }
   } while(pKey);
   return s32i;
}